

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFGS.cpp
# Opt level: O3

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::BFGS::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,BFGS *this,
          Problem *P,RealType param_2,DynamicVector<double,_std::allocator<double>_> *oldGradient)

{
  DynamicRectMatrix<double> *m;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  double **ppdVar4;
  double *pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  uint nrow;
  pointer pdVar9;
  long lVar10;
  size_type __n;
  ulong uVar11;
  size_t j_2;
  ulong uVar12;
  size_t j_1;
  size_t j;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  DynamicVector<double,_std::allocator<double>_> diffGradientWithHessianApplied;
  allocator_type local_89;
  vector<double,_std::allocator<double>_> local_88;
  DynamicVector<double,_std::allocator<double>_> local_70;
  double local_58;
  double dStack_50;
  DynamicRectMatrix<double> local_40;
  
  m = &this->inverseHessian_;
  if ((this->inverseHessian_).nrow_ == 0) {
    nrow = (uint)((ulong)((long)(P->currentValue_).data_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(P->currentValue_).data_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              ((DynamicRectMatrix<double> *)&local_88,nrow,nrow,0.0);
    OpenMD::DynamicRectMatrix<double>::operator=(&local_40,m);
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
    OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_88);
    pdVar3 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pdVar9 - (long)pdVar3;
    pdVar7 = pdVar9;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 3;
      ppdVar4 = m->data_;
      uVar11 = 0;
      do {
        ppdVar4[uVar11 & 0xffffffff][uVar11 & 0xffffffff] = 1.0;
        uVar11 = uVar11 + 1;
        pdVar7 = pdVar3;
      } while (lVar8 + (ulong)(lVar8 == 0) != uVar11);
    }
  }
  else {
    pdVar9 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  local_70.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_88,(long)pdVar9 - (long)pdVar7 >> 3,(value_type_conflict1 *)&local_70,&local_89)
  ;
  OpenMD::operator-(&local_70,&((this->super_LineSearchBasedMethod).lineSearch_)->gradient_,
                    oldGradient);
  pdVar7 = local_70.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar18 = 0.0;
  dVar19 = 0.0;
  lVar8 = (long)pdVar3 - (long)pdVar9;
  if (lVar8 == 0) {
    dVar16 = 0.0;
  }
  else {
    lVar8 = lVar8 >> 3;
    ppdVar4 = m->data_;
    uVar11 = lVar8 + (ulong)(lVar8 == 0);
    uVar12 = 0;
    do {
      pdVar5 = ppdVar4[uVar12 & 0xffffffff];
      pdVar15 = (double *)
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
      uVar13 = 0;
      do {
        pdVar15 = (double *)
                  ((double)pdVar15 +
                  pdVar5[uVar13 & 0xffffffff] *
                  local_70.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13]);
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar12] = (double)pdVar15;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
    dVar16 = 0.0;
    if (pdVar3 != pdVar9) {
      dVar18 = 0.0;
      dVar19 = 0.0;
      lVar10 = 0;
      dVar16 = 0.0;
      dVar17 = 0.0;
      do {
        dVar1 = local_70.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        dVar2 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        dVar18 = dVar18 + dVar2 * dVar1;
        dVar19 = dVar19 + (double)local_88.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar10] * dVar1;
        dVar16 = dVar16 + dVar2 * dVar2;
        dVar17 = dVar17 + dVar1 * dVar1;
        lVar10 = lVar10 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
      dVar16 = dVar17 * 1e-08 * dVar16;
    }
  }
  if (dVar16 < 0.0) {
    local_58 = dVar18;
    dStack_50 = dVar19;
    dVar16 = sqrt(dVar16);
    dVar18 = local_58;
    dVar19 = dStack_50;
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  pdVar9 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (dVar18 <= dVar16) {
    __n = (long)pdVar3 - (long)pdVar9 >> 3;
  }
  else {
    __n = (long)pdVar3 - (long)pdVar9 >> 3;
    if (pdVar3 != pdVar9) {
      pdVar6 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar8 = 0;
      do {
        pdVar7[lVar8] =
             pdVar6[lVar8] * (1.0 / dVar18) +
             (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8] * -(1.0 / dVar19);
        lVar8 = lVar8 + 1;
      } while (__n + (__n == 0) != lVar8);
      if (pdVar3 != pdVar9) {
        ppdVar4 = (this->inverseHessian_).data_;
        pdVar9 = (((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_).data_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = __n + (__n == 0);
        uVar12 = 0;
        do {
          pdVar15 = ppdVar4[uVar12 & 0xffffffff];
          uVar13 = 0;
          do {
            uVar14 = uVar13 & 0xffffffff;
            dVar16 = pdVar9[uVar12] * (1.0 / dVar18) * pdVar9[uVar13] + pdVar15[uVar14];
            pdVar15[uVar14] = dVar16;
            dVar16 = (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12] * -(1.0 / dVar19) *
                     (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13] + dVar16;
            pdVar15[uVar14] = dVar16;
            pdVar15[uVar14] = pdVar7[uVar12] * dVar19 * pdVar7[uVar13] + dVar16;
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar11);
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,__n,(allocator_type *)&local_70);
  lVar8 = (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    pdVar9 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppdVar4 = (this->inverseHessian_).data_;
    pdVar3 = (((this->super_LineSearchBasedMethod).lineSearch_)->gradient_).data_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar11 = lVar8 + (ulong)(lVar8 == 0);
    uVar12 = 0;
    do {
      pdVar9[uVar12] = 0.0;
      pdVar15 = ppdVar4[uVar12 & 0xffffffff];
      dVar18 = 0.0;
      uVar13 = 0;
      do {
        dVar18 = dVar18 - pdVar15[uVar13 & 0xffffffff] * pdVar3[uVar13];
        pdVar9[uVar12] = dVar18;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  if ((double **)
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double **)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pdVar7 != (pointer)0x0) {
    operator_delete(pdVar7,(long)local_70.data_.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> BFGS::getUpdatedDirection(
      const Problem& P, RealType, const DynamicVector<RealType>& oldGradient) {
    if (inverseHessian_.getNRow() == 0) {
      // first time in this update, we create needed structures
      inverseHessian_ = DynamicRectMatrix<RealType>(
          P.currentValue().size(), P.currentValue().size(), 0.);
      for (size_t i = 0; i < P.currentValue().size(); ++i)
        inverseHessian_(i, i) = 1.;
    }

    DynamicVector<RealType> diffGradient;
    DynamicVector<RealType> diffGradientWithHessianApplied(
        P.currentValue().size(), 0.);

    diffGradient = lineSearch_->lastGradient() - oldGradient;
    for (size_t i = 0; i < P.currentValue().size(); ++i)
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        diffGradientWithHessianApplied[i] +=
            inverseHessian_(i, j) * diffGradient[j];

    double fac, fae, fad;
    double sumdg, sumxi;

    fac = fae = sumdg = sumxi = 0.;
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      fac += diffGradient[i] * lineSearch_->searchDirection()[i];
      fae += diffGradient[i] * diffGradientWithHessianApplied[i];
      sumdg += std::pow(diffGradient[i], 2.);
      sumxi += std::pow(lineSearch_->searchDirection()[i], 2.);
    }

    if (fac > std::sqrt(1e-8 * sumdg *
                        sumxi))  // skip update if fac not sufficiently positive
    {
      fac = 1.0 / fac;
      fad = 1.0 / fae;

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        diffGradient[i] = fac * lineSearch_->searchDirection()[i] -
                          fad * diffGradientWithHessianApplied[i];

      for (size_t i = 0; i < P.currentValue().size(); ++i)
        for (size_t j = 0; j < P.currentValue().size(); ++j) {
          inverseHessian_(i, j) += fac * lineSearch_->searchDirection()[i] *
                                   lineSearch_->searchDirection()[j];
          inverseHessian_(i, j) -= fad * diffGradientWithHessianApplied[i] *
                                   diffGradientWithHessianApplied[j];
          inverseHessian_(i, j) += fae * diffGradient[i] * diffGradient[j];
        }
    }
    // else
    //  throw "BFGS: FAC not sufficiently positive";

    DynamicVector<RealType> direction(P.currentValue().size());
    for (size_t i = 0; i < P.currentValue().size(); ++i) {
      direction[i] = 0.0;
      for (size_t j = 0; j < P.currentValue().size(); ++j)
        direction[i] -= inverseHessian_(i, j) * lineSearch_->lastGradient()[j];
    }

    return direction;
  }